

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::Board(Board *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
            BoardSize size,BoardMode mode)

{
  mapped_type *pmVar1;
  BoardSize local_1c;
  BoardMode mode_local;
  BoardSize size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  Board *this_local;
  
  this->size = size;
  local_1c = size;
  _mode_local = values;
  values_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  pmVar1 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_1c);
  this->sizeInt = *pmVar1;
  this->mode = mode;
  this->nullValue = this->sizeInt * this->sizeInt - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->values,_mode_local);
  return;
}

Assistant:

Board::Board( std::vector<size_t>&& values, BoardSize size, BoardMode mode ) : size( size ),
                                                                               mode( mode ),
                                                                               sizeInt( Maps::boardSizeInt.at( size )),
                                                                               values( std::move( values )),
                                                                               nullValue( sizeInt * sizeInt - 1 ) {}